

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMesh.h
# Opt level: O2

void __thiscall irr::scene::SMesh::recalculateBoundingBox(SMesh *this)

{
  aabbox3d<float> *this_00;
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  bool bVar5;
  aabbox3d<float> *this_01;
  u32 i;
  ulong uVar6;
  
  this_00 = &this->BoundingBox;
  uVar6 = 0;
  bVar3 = false;
  while( true ) {
    lVar1 = *(long *)&(this->super_IMesh).field_0x8;
    if (((ulong)(*(long *)&(this->super_IMesh).field_0x10 - lVar1) >> 3 & 0xffffffff) <= uVar6)
    break;
    this_01 = (aabbox3d<float> *)(**(code **)(**(long **)(lVar1 + uVar6 * 8) + 0x50))();
    bVar5 = core::aabbox3d<float>::isEmpty(this_01);
    if (!bVar5) {
      if (bVar3) {
        core::aabbox3d<float>::addInternalBox(this_00,this_01);
      }
      else {
        fVar4 = (this_01->MaxEdge).Z;
        (this->BoundingBox).MaxEdge.Y = (this_01->MaxEdge).Y;
        (this->BoundingBox).MaxEdge.Z = fVar4;
        fVar4 = (this_01->MinEdge).Y;
        uVar2 = *(undefined8 *)&(this_01->MinEdge).Z;
        (this_00->MinEdge).X = (this_01->MinEdge).X;
        (this_00->MinEdge).Y = fVar4;
        *(undefined8 *)&(this->BoundingBox).MinEdge.Z = uVar2;
        bVar3 = true;
      }
    }
    uVar6 = uVar6 + 1;
  }
  if (!bVar3) {
    (this->BoundingBox).MaxEdge.X = 0.0;
    (this->BoundingBox).MaxEdge.Y = 0.0;
    (this->BoundingBox).MaxEdge.Z = 0.0;
    (this->BoundingBox).MinEdge.Z = 0.0;
    (this_00->MinEdge).X = 0.0;
    (this_00->MinEdge).Y = 0.0;
  }
  return;
}

Assistant:

void recalculateBoundingBox()
	{
		bool hasMeshBufferBBox = false;
		for (u32 i = 0; i < MeshBuffers.size(); ++i) {
			const core::aabbox3df &bb = MeshBuffers[i]->getBoundingBox();
			if (!bb.isEmpty()) {
				if (!hasMeshBufferBBox) {
					hasMeshBufferBBox = true;
					BoundingBox = bb;
				} else {
					BoundingBox.addInternalBox(bb);
				}
			}
		}

		if (!hasMeshBufferBBox)
			BoundingBox.reset(0.0f, 0.0f, 0.0f);
	}